

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result wabt::ParseWatModule
                 (WastLexer *lexer,
                 unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module,
                 Errors *errors,WastParseOptions *options)

{
  Result RVar1;
  Result RVar2;
  long lVar3;
  WastParser parser;
  undefined8 uStack_e8;
  undefined8 uStack_dc;
  code *pcStack_d0;
  WastParser local_c8;
  
  if (out_module == (unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)0x0) {
    pcStack_d0 = (code *)0x14165d;
    __assert_fail("out_module != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                  ,0xe00,
                  "Result wabt::ParseWatModule(WastLexer *, std::unique_ptr<Module> *, Errors *, WastParseOptions *)"
                 );
  }
  if (options == (WastParseOptions *)0x0) {
    pcStack_d0 = ParseWastScript;
    __assert_fail("options != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                  ,0xe01,
                  "Result wabt::ParseWatModule(WastLexer *, std::unique_ptr<Module> *, Errors *, WastParseOptions *)"
                 );
  }
  local_c8.last_module_index_ = 0xffffffff;
  lVar3 = 0x40;
  do {
    *(undefined8 *)((long)&uStack_dc + lVar3) = 0;
    *(undefined8 *)(&stack0xffffffffffffff2c + lVar3) = 0;
    *(undefined8 *)((long)&uStack_e8 + lVar3) = 0;
    *(undefined8 *)(&stack0xffffffffffffff20 + lVar3) = 0;
    *(undefined4 *)((long)local_c8.tokens_.contents_._M_elems + lVar3 + -0x20) = 0;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0xc0);
  local_c8.tokens_.size_ = 0;
  local_c8.tokens_.front_ = 0;
  pcStack_d0 = (code *)0x14160b;
  local_c8.lexer_ = lexer;
  local_c8.errors_ = errors;
  local_c8.options_ = options;
  RVar1 = WastParser::ParseModule(&local_c8,out_module);
  while (local_c8.tokens_.size_ != 0) {
    pcStack_d0 = (code *)0x14161f;
    CircularArray<wabt::Token,_2UL>::pop_back(&local_c8.tokens_);
  }
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = RVar1.enum_ == Error;
  return (Result)RVar2.enum_;
}

Assistant:

Result ParseWatModule(WastLexer* lexer,
                      std::unique_ptr<Module>* out_module,
                      Errors* errors,
                      WastParseOptions* options) {
  assert(out_module != nullptr);
  assert(options != nullptr);
  WastParser parser(lexer, errors, options);
  CHECK_RESULT(parser.ParseModule(out_module));
  return Result::Ok;
}